

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speculative.cpp
# Opt level: O2

llama_tokens *
common_speculative_gen_draft
          (llama_tokens *__return_storage_ptr__,common_speculative *spec,
          common_speculative_params params,llama_tokens *prompt_tgt,llama_token id_last)

{
  float *pfVar1;
  llama_token lVar2;
  pointer piVar3;
  const_iterator __first;
  llama_batch *batch;
  llama_tokens *this;
  int iVar4;
  common_log *pcVar5;
  llama_token_data_array *plVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  pointer piVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  undefined8 in_stack_ffffffffffffff08;
  undefined4 uVar19;
  llama_token id;
  llama_batch *local_a8;
  int local_9c;
  llama_token id_last_local;
  allocator_type local_91;
  llama_tokens *local_90;
  ulong local_88;
  llama_tokens *local_80;
  ulong local_78;
  undefined8 local_70;
  float local_68;
  int local_64;
  string local_60;
  llama_token_data_array *local_40;
  long local_38;
  
  uVar19 = (undefined4)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  local_68 = params.p_min;
  local_a8 = &spec->batch;
  local_80 = &spec->prompt;
  id_last_local = id_last;
  local_90 = __return_storage_ptr__;
  iVar4 = llama_n_ctx(spec->ctx);
  iVar4 = iVar4 - params.n_draft;
  piVar3 = (prompt_tgt->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar7 = (int)((ulong)((long)(prompt_tgt->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar3) >> 2);
  uVar18 = iVar7 - iVar4;
  uVar8 = 0;
  uVar15 = (ulong)uVar18;
  if ((int)uVar18 < 1) {
    uVar15 = uVar8;
  }
  piVar10 = (spec->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar11 = (ulong)((long)(spec->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)piVar10) >> 2;
  uVar12 = 0;
  if (0 < (int)uVar11) {
    uVar12 = uVar11 & 0xffffffff;
  }
  uVar17 = 0;
  local_78 = 0;
  do {
    uVar13 = local_78;
    iVar16 = (int)uVar17;
    if (uVar8 == uVar12) {
      local_70 = params._0_8_;
      if (0 < common_log_verbosity_thold) {
        pcVar5 = common_log_main();
        common_log_add(pcVar5,GGML_LOG_LEVEL_DEBUG,"%s: reuse_i = %d, reuse_n = %d, prompt = %d\n",
                       "common_speculative_gen_draft",uVar13,uVar17,
                       CONCAT44(uVar19,(int)((ulong)((long)(spec->prompt).
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(spec->prompt).
                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) >> 2)));
      }
      (local_90->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      (local_90->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      (local_90->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::vector<int,_std::allocator<int>_>::reserve(local_90,(long)(int)local_70);
      uVar8 = local_78;
      this = local_90;
      if (iVar16 == 0) {
        llama_kv_self_clear(spec->ctx);
        piVar3 = (spec->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((spec->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish != piVar3) {
          (spec->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = piVar3;
        }
      }
      else {
        iVar7 = (int)uVar13 + iVar16;
        piVar3 = (spec->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar4 = (int)((ulong)((long)(spec->prompt).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)piVar3) >> 2);
        if ((iVar7 < iVar4) && (lVar14 = (long)iVar7, piVar3[lVar14] == id_last_local)) {
          lVar9 = lVar14 * 4;
          do {
            lVar9 = lVar9 + 4;
            lVar14 = lVar14 + 1;
            piVar3 = (spec->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((int)((ulong)((long)(spec->prompt).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)piVar3) >> 2)
                <= lVar14) {
              return local_90;
            }
            std::vector<int,_std::allocator<int>_>::push_back
                      (this,(value_type_conflict *)((long)piVar3 + lVar9));
          } while ((int)((ulong)((long)(this->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                       .super__Vector_impl_data._M_finish -
                                (long)(this->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                      super__Vector_impl_data._M_start) >> 2) < (int)local_70);
          return local_90;
        }
        if (0 < (int)local_78) {
          llama_kv_self_seq_rm(spec->ctx,0,0,local_78 & 0xffffffff);
          llama_kv_self_seq_add(spec->ctx,0,uVar8 & 0xffffffff,0xffffffffffffffff);
          __first._M_current =
               (local_80->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
          std::vector<int,_std::allocator<int>_>::erase
                    (local_80,__first,(const_iterator)(__first._M_current + (uVar8 & 0xffffffff)));
          iVar4 = (int)((ulong)((long)(spec->prompt).super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                               (long)(spec->prompt).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start) >> 2);
        }
        if (iVar16 < iVar4) {
          llama_kv_self_seq_rm(spec->ctx,0,uVar17,0xffffffffffffffff);
          std::vector<int,_std::allocator<int>_>::erase
                    (local_80,(const_iterator)
                              ((spec->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + uVar17),
                     (const_iterator)
                     (spec->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish);
        }
      }
      common_batch_clear(local_a8);
      uVar15 = (ulong)((int)uVar15 + iVar16);
      lVar14 = uVar15 * 4;
      for (; piVar3 = (prompt_tgt->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start,
          uVar15 < (ulong)((long)(prompt_tgt->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                 .super__Vector_impl_data._M_finish - (long)piVar3 >> 2);
          uVar15 = uVar15 + 1) {
        lVar2 = *(llama_token *)((long)piVar3 + lVar14);
        id = 0;
        __l._M_len = 1;
        __l._M_array = &id;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&local_60,__l,(allocator_type *)&local_9c);
        common_batch_add(local_a8,lVar2,(int)uVar17,(vector<int,_std::allocator<int>_> *)&local_60,
                         false);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&local_60);
        std::vector<int,_std::allocator<int>_>::push_back
                  (local_80,(value_type_conflict *)
                            ((long)(prompt_tgt->super__Vector_base<int,_std::allocator<int>_>).
                                   _M_impl.super__Vector_impl_data._M_start + lVar14));
        lVar14 = lVar14 + 4;
        uVar17 = (ulong)((int)uVar17 + 1);
      }
      if (0 < local_a8->n_tokens) {
        llama_decode(spec->ctx);
      }
      batch = local_a8;
      local_88 = (ulong)((long)(spec->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(spec->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2;
      if (0 < common_log_verbosity_thold) {
        pcVar5 = common_log_main();
        common_log_add(pcVar5,GGML_LOG_LEVEL_DEBUG,"%s: n_past = %d\n",
                       "common_speculative_gen_draft",local_88);
      }
      common_batch_clear(batch);
      lVar2 = id_last_local;
      id = 0;
      __l_00._M_len = 1;
      __l_00._M_array = &id;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_60,__l_00,(allocator_type *)&local_9c);
      common_batch_add(batch,lVar2,(llama_pos)local_88,
                       (vector<int,_std::allocator<int>_> *)&local_60,true);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_60);
      std::vector<int,_std::allocator<int>_>::push_back(local_80,&id_last_local);
      llama_decode(spec->ctx);
      common_sampler_reset(spec->smpl);
      local_88 = (ulong)((int)local_88 + 1);
      uVar15 = 0;
      local_64 = 0;
      if (0 < (int)local_70) {
        local_64 = (int)local_70;
      }
      while( true ) {
        iVar4 = (int)uVar15;
        if (iVar4 == local_64) {
          return local_90;
        }
        common_batch_clear(local_a8);
        common_sampler_sample(spec->smpl,spec->ctx,0,true);
        plVar6 = common_sampler_get_candidates(spec->smpl);
        lVar14 = 8;
        uVar8 = 0;
        local_40 = plVar6;
        while( true ) {
          iVar7 = (int)plVar6->size;
          if (2 < iVar7) {
            iVar7 = 3;
          }
          if ((long)iVar7 <= (long)uVar8) break;
          if (0 < common_log_verbosity_thold) {
            pcVar5 = common_log_main();
            uVar18 = *(uint *)((long)plVar6->data + lVar14 + -8);
            local_78 = CONCAT44(local_78._4_4_,*(undefined4 *)((long)&plVar6->data->id + lVar14));
            local_38 = lVar14;
            common_token_to_piece_abi_cxx11_(&local_60,spec->ctx,uVar18,true);
            common_log_add(pcVar5,GGML_LOG_LEVEL_DEBUG,
                           " - draft candidate %3d, pos %3d: %6d (%8.3f) \'%s\'\n",
                           SUB84((double)(float)local_78,0),uVar8 & 0xffffffff,uVar15,(ulong)uVar18,
                           local_60._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&local_60);
            plVar6 = local_40;
            lVar14 = local_38;
          }
          uVar8 = uVar8 + 1;
          lVar14 = lVar14 + 0xc;
        }
        id = plVar6->data->id;
        common_sampler_accept(spec->smpl,id,true);
        std::vector<int,_std::allocator<int>_>::push_back(local_90,&id);
        lVar2 = id;
        if ((int)local_70 <=
            (int)((ulong)((long)(local_90->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(local_90->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start) >> 2)) break;
        pfVar1 = &plVar6->data->p;
        if (*pfVar1 <= local_68 && local_68 != *pfVar1) {
          return local_90;
        }
        local_9c = 0;
        __l_01._M_len = 1;
        __l_01._M_array = &local_9c;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&local_60,__l_01,&local_91);
        common_batch_add(local_a8,lVar2,(int)local_88 + iVar4,
                         (vector<int,_std::allocator<int>_> *)&local_60,true);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&local_60);
        llama_decode(spec->ctx);
        std::vector<int,_std::allocator<int>_>::push_back(local_80,&id);
        uVar15 = (ulong)(iVar4 + 1);
      }
      return local_90;
    }
    for (uVar13 = 0; (long)(uVar15 + uVar13) < (long)iVar7; uVar13 = uVar13 + 1) {
      if ((uVar11 & 0xffffffff) == uVar13) {
        uVar13 = uVar11 & 0xffffffff;
        break;
      }
      if (piVar3[uVar15 + uVar13] != piVar10[uVar13]) break;
    }
    if (((params.n_reuse <= (int)uVar13) || (iVar7 <= iVar4)) && (iVar16 < (int)uVar13)) {
      uVar17 = uVar13 & 0xffffffff;
      local_78 = uVar8 & 0xffffffff;
    }
    uVar8 = uVar8 + 1;
    uVar11 = (ulong)((int)uVar11 - 1);
    piVar10 = piVar10 + 1;
  } while( true );
}

Assistant:

llama_tokens common_speculative_gen_draft(
        struct common_speculative * spec,
        struct common_speculative_params params,
        const llama_tokens & prompt_tgt,
        llama_token id_last) {
    auto & batch  = spec->batch;
    auto & ctx    = spec->ctx;
    auto & smpl   = spec->smpl;
    auto & prompt = spec->prompt;

    int reuse_i = 0;
    int reuse_n = 0;

    const int n_ctx = llama_n_ctx(ctx) - params.n_draft;

    const int i_start = std::max<int>(0, (int) prompt_tgt.size() - n_ctx);

    // reuse as much as possible from the old draft context
    // ideally, the draft context should be as big as the target context and we will always reuse the entire prompt
    for (int i = 0; i < (int) prompt.size(); ++i) {
        int cur = 0;
        while (i_start + cur < (int) prompt_tgt.size() &&
               i       + cur < (int) prompt.size() &&
               prompt_tgt[i_start + cur] == prompt[i + cur]) {
            cur++;
        }

        if ((cur >= params.n_reuse || n_ctx >= (int) prompt_tgt.size()) && cur > reuse_n) {
            reuse_i = i;
            reuse_n = cur;
        }
    }

    LOG_DBG("%s: reuse_i = %d, reuse_n = %d, prompt = %d\n", __func__, reuse_i, reuse_n, (int) prompt.size());

    llama_tokens result;
    result.reserve(params.n_draft);

    if (reuse_n == 0) {
        llama_kv_self_clear(ctx);

        prompt.clear();
    } else {
        // this happens when a previous draft has been discarded (for example, due to being too small), but the
        // target model agreed with it. in this case, we simply pass back the previous results to save compute
        if (reuse_i + reuse_n < (int) prompt.size() && prompt[reuse_i + reuse_n] == id_last) {
            for (int i = reuse_i + reuse_n + 1; i < (int) prompt.size(); ++i) {
                result.push_back(prompt[i]);

                if (params.n_draft <= (int) result.size()) {
                    break;
                }
            }

            return result;
        }

        if (reuse_i > 0) {
            llama_kv_self_seq_rm (ctx, 0, 0, reuse_i);
            llama_kv_self_seq_add(ctx, 0, reuse_i, -1, -reuse_i);

            prompt.erase(prompt.begin(), prompt.begin() + reuse_i);
        }

        if (reuse_n < (int) prompt.size()) {
            llama_kv_self_seq_rm (ctx, 0, reuse_n, -1);

            prompt.erase(prompt.begin() + reuse_n, prompt.end());
        }
    }

    // prepare a batch to evaluate any new tokens in the prompt
    common_batch_clear(batch);

    for (size_t i = i_start + reuse_n; i < prompt_tgt.size(); ++i) {
        //LOG_DBG("i = %d, i_start = %d, reuse_n = %d, i - i_start = %d, id = %6d\n", i, i_start, reuse_n, i - i_start, prompt_tgt[i]);
        common_batch_add(batch, prompt_tgt[i], i - i_start, { 0 }, false);

        prompt.push_back(prompt_tgt[i]);
    }

    // we should rarely end-up here during normal decoding
    if (batch.n_tokens > 0) {
        //LOG_DBG("%s: draft prompt batch: %s\n", __func__, string_from(ctx, batch).c_str());

        llama_decode(ctx, batch);
    }

    const llama_pos n_past = prompt.size();

    LOG_DBG("%s: n_past = %d\n", __func__, n_past);

    common_batch_clear(batch);
    common_batch_add  (batch, id_last, n_past, { 0 }, true);

    prompt.push_back(id_last);

    //LOG_DBG("%s: draft prompt: %s\n", __func__, string_from(ctx, prompt).c_str());

    llama_decode(ctx, batch);

    common_sampler_reset(smpl);

    // sample n_draft tokens from the draft model
    for (int i = 0; i < params.n_draft; ++i) {
        common_batch_clear(batch);

        common_sampler_sample(smpl, ctx, 0, true);

        const auto * cur_p = common_sampler_get_candidates(smpl);

        for (int k = 0; k < std::min(3, (int) cur_p->size); ++k) {
            LOG_DBG(" - draft candidate %3d, pos %3d: %6d (%8.3f) '%s'\n",
                    k, i, cur_p->data[k].id, cur_p->data[k].p, common_token_to_piece(ctx, cur_p->data[k].id).c_str());
        }

        // add drafted token for each sequence
        const llama_token id = cur_p->data[0].id;

        common_sampler_accept(smpl, id, true);

        result.push_back(id);

        if (params.n_draft <= (int) result.size()) {
            break;
        }

        // only collect very high-confidence draft tokens
        if (cur_p->data[0].p < params.p_min) {
            break;
        }

        common_batch_add(batch, id, n_past + i + 1, { 0 }, true);

        // evaluate the drafted tokens on the draft model
        llama_decode(ctx, batch);

        prompt.push_back(id);
    }

    return result;
}